

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Sigmoid_x86::forward_inplace(Sigmoid_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  float *pfVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  auVar2 = _DAT_003144d0;
  auVar11 = _DAT_003144c0;
  uVar1 = bottom_top_blob->c;
  uVar8 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar1) {
      uVar5 = 0;
      do {
        if (0 < (int)uVar8) {
          pfVar6 = (float *)(bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                            (long)bottom_top_blob->data);
          uVar7 = uVar8;
          do {
            auVar13._0_8_ = *(ulong *)pfVar6 ^ 0x8000000080000000;
            auVar13._8_4_ = -pfVar6[2];
            auVar13._12_4_ = -pfVar6[3];
            auVar14 = minps(auVar13,auVar11);
            auVar14 = maxps(auVar14,auVar2);
            fVar20 = auVar14._0_4_ * 1.442695 + 0.5;
            fVar22 = auVar14._4_4_ * 1.442695 + 0.5;
            fVar24 = auVar14._8_4_ * 1.442695 + 0.5;
            fVar25 = auVar14._12_4_ * 1.442695 + 0.5;
            fVar16 = (float)(int)fVar20;
            fVar17 = (float)(int)fVar22;
            fVar18 = (float)(int)fVar24;
            fVar19 = (float)(int)fVar25;
            fVar16 = fVar16 - (float)(-(uint)(fVar20 < fVar16) & 0x3f800000);
            fVar17 = fVar17 - (float)(-(uint)(fVar22 < fVar17) & 0x3f800000);
            fVar18 = fVar18 - (float)(-(uint)(fVar24 < fVar18) & 0x3f800000);
            fVar19 = fVar19 - (float)(-(uint)(fVar25 < fVar19) & 0x3f800000);
            fVar20 = fVar16 * -0.6931472 + auVar14._0_4_;
            fVar22 = fVar17 * -0.6931472 + auVar14._4_4_;
            fVar24 = fVar18 * -0.6931472 + auVar14._8_4_;
            fVar25 = fVar19 * -0.6931472 + auVar14._12_4_;
            auVar15._0_4_ = fVar20 * fVar20;
            auVar15._4_4_ = fVar22 * fVar22;
            auVar15._8_4_ = fVar24 * fVar24;
            auVar15._12_4_ = fVar25 * fVar25;
            fVar21 = (float)((int)fVar16 * 0x800000 + 0x3f800000) *
                     (fVar20 + 1.0 +
                     (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
                       0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5) * auVar15._0_4_) + 1.0;
            fVar23 = (float)((int)fVar17 * 0x800000 + 0x3f800000) *
                     (fVar22 + 1.0 +
                     (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
                       0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5) * auVar15._4_4_) + 1.0;
            fVar18 = (float)((int)fVar18 * 0x800000 + 0x3f800000) *
                     (fVar24 + 1.0 +
                     (((((fVar24 * 0.00019875691 + 0.0013981999) * fVar24 + 0.008333452) * fVar24 +
                       0.041665796) * fVar24 + 0.16666666) * fVar24 + 0.5) * auVar15._8_4_) + 1.0;
            fVar24 = (float)((int)fVar19 * 0x800000 + 0x3f800000) *
                     (fVar25 + 1.0 +
                     (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
                       0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5) * auVar15._12_4_) + 1.0;
            auVar3._4_4_ = fVar23;
            auVar3._0_4_ = fVar21;
            auVar3._8_4_ = fVar18;
            auVar3._12_4_ = fVar24;
            auVar14 = rcpps(auVar15,auVar3);
            fVar16 = auVar14._0_4_;
            fVar20 = auVar14._4_4_;
            fVar17 = auVar14._8_4_;
            fVar22 = auVar14._12_4_;
            *pfVar6 = (1.0 - fVar21 * fVar16) * fVar16 + fVar16;
            pfVar6[1] = (1.0 - fVar23 * fVar20) * fVar20 + fVar20;
            pfVar6[2] = (1.0 - fVar18 * fVar17) * fVar17 + fVar17;
            pfVar6[3] = (1.0 - fVar24 * fVar22) * fVar22 + fVar22;
            pfVar6 = pfVar6 + 4;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar1);
    }
  }
  else if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      pfVar6 = (float *)(bottom_top_blob->cstep * uVar5 * bottom_top_blob->elemsize +
                        (long)bottom_top_blob->data);
      if ((int)uVar8 < 4) {
        uVar7 = 0;
      }
      else {
        iVar4 = 3;
        do {
          auVar10._0_8_ = *(ulong *)pfVar6 ^ 0x8000000080000000;
          auVar10._8_4_ = -pfVar6[2];
          auVar10._12_4_ = -pfVar6[3];
          auVar2._8_4_ = 0x42b0c0a5;
          auVar2._0_8_ = 0x42b0c0a542b0c0a5;
          auVar2._12_4_ = 0x42b0c0a5;
          auVar11 = minps(auVar10,auVar2);
          auVar14._8_4_ = 0xc2b0c0a5;
          auVar14._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar14._12_4_ = 0xc2b0c0a5;
          auVar11 = maxps(auVar11,auVar14);
          fVar20 = auVar11._0_4_ * 1.442695 + 0.5;
          fVar22 = auVar11._4_4_ * 1.442695 + 0.5;
          fVar24 = auVar11._8_4_ * 1.442695 + 0.5;
          fVar25 = auVar11._12_4_ * 1.442695 + 0.5;
          fVar16 = (float)(int)fVar20;
          fVar17 = (float)(int)fVar22;
          fVar18 = (float)(int)fVar24;
          fVar19 = (float)(int)fVar25;
          fVar16 = fVar16 - (float)(-(uint)(fVar20 < fVar16) & 0x3f800000);
          fVar17 = fVar17 - (float)(-(uint)(fVar22 < fVar17) & 0x3f800000);
          fVar18 = fVar18 - (float)(-(uint)(fVar24 < fVar18) & 0x3f800000);
          fVar19 = fVar19 - (float)(-(uint)(fVar25 < fVar19) & 0x3f800000);
          fVar20 = fVar16 * -0.6931472 + auVar11._0_4_;
          fVar22 = fVar17 * -0.6931472 + auVar11._4_4_;
          fVar24 = fVar18 * -0.6931472 + auVar11._8_4_;
          fVar25 = fVar19 * -0.6931472 + auVar11._12_4_;
          auVar12._0_4_ = fVar20 * fVar20;
          auVar12._4_4_ = fVar22 * fVar22;
          auVar12._8_4_ = fVar24 * fVar24;
          auVar12._12_4_ = fVar25 * fVar25;
          fVar21 = (float)((int)fVar16 * 0x800000 + 0x3f800000) *
                   (fVar20 + 1.0 +
                   (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
                     0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5) * auVar12._0_4_) + 1.0;
          fVar23 = (float)((int)fVar17 * 0x800000 + 0x3f800000) *
                   (fVar22 + 1.0 +
                   (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
                     0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5) * auVar12._4_4_) + 1.0;
          fVar18 = (float)((int)fVar18 * 0x800000 + 0x3f800000) *
                   (fVar24 + 1.0 +
                   (((((fVar24 * 0.00019875691 + 0.0013981999) * fVar24 + 0.008333452) * fVar24 +
                     0.041665796) * fVar24 + 0.16666666) * fVar24 + 0.5) * auVar12._8_4_) + 1.0;
          fVar24 = (float)((int)fVar19 * 0x800000 + 0x3f800000) *
                   (fVar25 + 1.0 +
                   (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
                     0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5) * auVar12._12_4_) + 1.0;
          auVar11._4_4_ = fVar23;
          auVar11._0_4_ = fVar21;
          auVar11._8_4_ = fVar18;
          auVar11._12_4_ = fVar24;
          auVar11 = rcpps(auVar12,auVar11);
          fVar16 = auVar11._0_4_;
          fVar20 = auVar11._4_4_;
          fVar17 = auVar11._8_4_;
          fVar22 = auVar11._12_4_;
          *pfVar6 = (1.0 - fVar21 * fVar16) * fVar16 + fVar16;
          pfVar6[1] = (1.0 - fVar23 * fVar20) * fVar20 + fVar20;
          pfVar6[2] = (1.0 - fVar18 * fVar17) * fVar17 + fVar17;
          pfVar6[3] = (1.0 - fVar24 * fVar22) * fVar22 + fVar22;
          pfVar6 = pfVar6 + 4;
          iVar4 = iVar4 + 4;
          uVar7 = uVar8 & 0xfffffffc;
        } while (iVar4 < (int)uVar8);
      }
      if (uVar8 - uVar7 != 0 && (int)uVar7 <= (int)uVar8) {
        lVar9 = 0;
        do {
          fVar16 = expf(-pfVar6[lVar9]);
          pfVar6[lVar9] = 1.0 / (fVar16 + 1.0);
          lVar9 = lVar9 + 1;
        } while (uVar8 - uVar7 != (int)lVar9);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar1);
  }
  return 0;
}

Assistant:

int Sigmoid_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, sigmoid_avx(_p));
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, sigmoid_sse(_p));
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, sigmoid_avx(_p));
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(ptr, sigmoid_sse(_p));
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + exp(-*ptr));

            ptr++;
        }
    }

    return 0;
}